

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Node __thiscall xt::vector::newPath(vector *this,uint level,Node *node)

{
  uint level_00;
  _Node *this_00;
  __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *this_02;
  reference this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Node NVar2;
  shared_ptr<xt::_Node> local_78;
  shared_ptr<xt::_Node> local_68;
  Object local_58;
  undefined1 local_21;
  Node *local_20;
  Node *node_local;
  vector *pvStack_10;
  uint level_local;
  Node *ret;
  
  local_20 = node;
  node_local._4_4_ = level;
  pvStack_10 = this;
  if (level == 0) {
    std::shared_ptr<xt::_Node>::shared_ptr((shared_ptr<xt::_Node> *)this,node);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_21 = 0;
    this_00 = (_Node *)operator_new(0x10);
    _Node::_Node(this_00);
    std::shared_ptr<xt::_Node>::shared_ptr<xt::_Node,void>((shared_ptr<xt::_Node> *)this,this_00);
    level_00 = node_local._4_4_ - 5;
    std::shared_ptr<xt::_Node>::shared_ptr(&local_78,node);
    newPath((vector *)&local_68,level_00,&local_78);
    Object::Object<xt::_Node>(&local_58,&local_68);
    this_01 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
    this_02 = std::
              __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*(this_01);
    this_03 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[](this_02,0);
    Object::operator=(this_03,&local_58);
    Object::~Object(&local_58);
    std::shared_ptr<xt::_Node>::~shared_ptr(&local_68);
    std::shared_ptr<xt::_Node>::~shared_ptr(&local_78);
    _Var1._M_pi = extraout_RDX_00;
  }
  NVar2.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  NVar2.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar2.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node newPath(unsigned int level, Node node) {
	if (level == 0) return node;
	Node ret = Node(new _Node);
	(*ret->array)[0] = newPath(level - 5, node);
	return ret;
}